

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall jessilib::thread_pool::push(thread_pool *this,task_t *in_task)

{
  int iVar1;
  thread *ptVar2;
  
  ptVar2 = inactive_thread(this);
  if (ptVar2 != (thread *)0x0) {
    std::function<void_()>::operator=(&ptVar2->m_task,in_task);
    std::condition_variable::notify_one();
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_tasks_mutex);
  if (iVar1 == 0) {
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&(this->m_tasks).c,in_task);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_tasks_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void thread_pool::push(task_t in_task) {
	thread* target_thread = inactive_thread();

	if (target_thread != nullptr) {
		target_thread->m_task = in_task;
		target_thread->m_notifier.notify_one();
	}
	else {
		std::lock_guard<std::mutex> guard(m_tasks_mutex);
		m_tasks.push(in_task);
	}
}